

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreeSearchPointSwap(RtreeCursor *p,int i,int j)

{
  sqlite3_int64 *psVar1;
  RtreeDValue RVar2;
  RtreeSearchPoint *pRVar3;
  RtreeNode *pRVar4;
  sqlite3_int64 sVar5;
  undefined8 uVar6;
  sqlite3_int64 sVar7;
  RtreeSearchPoint *pRVar8;
  u8 uVar9;
  u8 uVar10;
  undefined5 uVar11;
  int iVar12;
  
  pRVar3 = p->aPoint;
  RVar2 = pRVar3[i].rScore;
  sVar5 = pRVar3[i].id;
  uVar6 = (&pRVar3[i].id)[1];
  sVar7 = pRVar3[j].id;
  pRVar3[i].rScore = pRVar3[j].rScore;
  pRVar3[i].id = sVar7;
  pRVar8 = pRVar3 + j;
  uVar9 = pRVar8->eWithin;
  uVar10 = pRVar8->iCell;
  uVar11 = *(undefined5 *)&pRVar8->field_0x13;
  pRVar3 = pRVar3 + i;
  pRVar3->iLevel = pRVar8->iLevel;
  pRVar3->eWithin = uVar9;
  pRVar3->iCell = uVar10;
  *(undefined5 *)&pRVar3->field_0x13 = uVar11;
  pRVar3 = p->aPoint;
  pRVar3[j].rScore = RVar2;
  psVar1 = &pRVar3[j].id;
  *psVar1 = sVar5;
  psVar1[1] = uVar6;
  if (i < 4) {
    iVar12 = i + 1;
    if (j < 4) {
      pRVar4 = p->aNode[iVar12];
      p->aNode[iVar12] = p->aNode[j + 1];
      p->aNode[j + 1] = pRVar4;
    }
    else {
      nodeRelease((Rtree *)(p->base).pVtab,p->aNode[iVar12]);
      p->aNode[iVar12] = (RtreeNode *)0x0;
    }
  }
  return;
}

Assistant:

static void rtreeSearchPointSwap(RtreeCursor *p, int i, int j){
  RtreeSearchPoint t = p->aPoint[i];
  assert( i<j );
  p->aPoint[i] = p->aPoint[j];
  p->aPoint[j] = t;
  i++; j++;
  if( i<RTREE_CACHE_SZ ){
    if( j>=RTREE_CACHE_SZ ){
      nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
      p->aNode[i] = 0;
    }else{
      RtreeNode *pTemp = p->aNode[i];
      p->aNode[i] = p->aNode[j];
      p->aNode[j] = pTemp;
    }
  }
}